

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

ZSTDVectorScanState * __thiscall
duckdb::ZSTDScanState::LoadVector(ZSTDScanState *this,idx_t vector_idx,idx_t internal_offset)

{
  unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
  *this_00;
  page_offset_t pVar1;
  block_id_t bVar2;
  uncompressed_size_t uVar3;
  compressed_size_t cVar4;
  BlockManager *pBVar5;
  bool bVar6;
  type pZVar7;
  pointer __p;
  pointer pZVar8;
  long lVar9;
  idx_t iVar10;
  string_length_t *psVar11;
  data_ptr_t pdVar12;
  idx_t iVar13;
  BufferHandle data_handle;
  shared_ptr<duckdb::BlockHandle,_true> block;
  BufferHandle local_58;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> local_38;
  
  bVar6 = UseVectorStateCache(this,vector_idx,internal_offset);
  if (bVar6) {
    pZVar7 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
             ::operator*(&this->current_vector);
    return pZVar7;
  }
  __p = (pointer)operator_new(0x80);
  (__p->buffer_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->buffer_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->buffer_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p->scanned_count = 0;
  __p->compressed_scan_count = 0;
  this_00 = &this->current_vector;
  ::std::
  __uniq_ptr_impl<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>::
  reset((__uniq_ptr_impl<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>
         *)this_00,__p);
  iVar13 = this->segment_count + vector_idx * -0x800;
  if (0x7ff < iVar13) {
    iVar13 = 0x800;
  }
  bVar2 = this->page_ids[vector_idx];
  pVar1 = this->page_offsets[vector_idx];
  uVar3 = this->uncompressed_sizes[vector_idx];
  cVar4 = this->compressed_sizes[vector_idx];
  pZVar8 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
           ::operator->(this_00);
  (pZVar8->metadata).vector_idx = vector_idx;
  (pZVar8->metadata).block_id = bVar2;
  (pZVar8->metadata).block_offset = pVar1;
  (pZVar8->metadata).uncompressed_size = uVar3;
  (pZVar8->metadata).compressed_size = cVar4;
  (pZVar8->metadata).count = iVar13;
  pZVar8 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
           ::operator->(this_00);
  pZVar7 = unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>,_true>
           ::operator*(this_00);
  if ((pZVar8->metadata).block_id == -1) {
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->segment_handle).node);
    pdVar12 = ((this->segment_handle).node.ptr)->buffer;
    lVar9 = this->segment_block_offset + 3;
  }
  else {
    UncompressedStringSegmentState::GetHandle
              ((UncompressedStringSegmentState *)&stack0xffffffffffffffc0,
               (BlockManager *)this->state,(block_id_t)this->block_manager);
    (*this->buffer_manager->_vptr_BufferManager[7])
              (&local_58,this->buffer_manager,
               (UncompressedStringSegmentState *)&stack0xffffffffffffffc0);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.node);
    pdVar12 = (local_58.node.ptr)->buffer;
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
    emplace_back<duckdb::BufferHandle>
              (&(pZVar7->buffer_handles).
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,&local_58)
    ;
    BufferHandle::~BufferHandle(&local_58);
    if ((_Head_base<0UL,_duckdb::StringBlock_*,_false>)local_38._M_head_impl !=
        (_Head_base<0UL,_duckdb::StringBlock_*,_false>)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl);
    }
    lVar9 = 3;
  }
  psVar11 = (string_length_t *)
            (pdVar12 + ((ulong)(pZVar8->metadata).block_offset + lVar9 & 0xfffffffffffffffc));
  pZVar7->current_buffer_ptr = (data_ptr_t)psVar11;
  iVar13 = (pZVar8->metadata).count;
  pZVar7->string_lengths = psVar11;
  psVar11 = psVar11 + iVar13;
  pZVar7->current_buffer_ptr = (data_ptr_t)psVar11;
  (pZVar7->in_buffer).src = psVar11;
  (pZVar7->in_buffer).pos = 0;
  pBVar5 = this->block_manager;
  iVar13 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
  iVar10 = optional_idx::GetIndex(&pBVar5->block_header_size);
  (pZVar7->in_buffer).size = (size_t)(pdVar12 + (iVar13 - (long)(iVar10 + (long)psVar11)) + -8);
  duckdb_zstd::ZSTD_DCtx_reset(this->decompression_context,ZSTD_reset_session_only);
  duckdb_zstd::ZSTD_DCtx_refDDict(this->decompression_context,(ZSTD_DDict *)0x0);
  if (internal_offset != 0) {
    Skip(this,pZVar7,internal_offset);
  }
  return pZVar7;
}

Assistant:

ZSTDVectorScanState &LoadVector(idx_t vector_idx, idx_t internal_offset) {
		if (UseVectorStateCache(vector_idx, internal_offset)) {
			return *current_vector;
		}
		current_vector = make_uniq<ZSTDVectorScanState>();
		current_vector->metadata = GetVectorMetadata(vector_idx);
		auto &metadata = current_vector->metadata;
		auto &scan_state = *current_vector;
		data_ptr_t handle_start;
		idx_t ptr_offset = 0;
		if (metadata.block_id == INVALID_BLOCK) {
			// Data lives on the segment's page
			handle_start = segment_handle.Ptr();
			ptr_offset += segment_block_offset;
		} else {
			// Data lives on an extra page, have to load the block first
			auto block = LoadPage(metadata.block_id);
			auto data_handle = buffer_manager.Pin(block);
			handle_start = data_handle.Ptr();
			scan_state.buffer_handles.push_back(std::move(data_handle));
		}

		ptr_offset += metadata.block_offset;
		ptr_offset = AlignValue<idx_t, sizeof(string_length_t)>(ptr_offset);
		scan_state.current_buffer_ptr = handle_start + ptr_offset;

		auto vector_size = metadata.count;

		scan_state.string_lengths = reinterpret_cast<string_length_t *>(scan_state.current_buffer_ptr);
		scan_state.current_buffer_ptr += (sizeof(string_length_t) * vector_size);

		// Update the in_buffer to point to the start of the compressed data frame
		idx_t current_offset = UnsafeNumericCast<idx_t>(scan_state.current_buffer_ptr - handle_start);
		scan_state.in_buffer.src = scan_state.current_buffer_ptr;
		scan_state.in_buffer.pos = 0;
		scan_state.in_buffer.size = block_manager.GetBlockSize() - sizeof(block_id_t) - current_offset;

		// Initialize the context for streaming decompression
		duckdb_zstd::ZSTD_DCtx_reset(decompression_context, duckdb_zstd::ZSTD_reset_session_only);
		duckdb_zstd::ZSTD_DCtx_refDDict(decompression_context, nullptr);

		if (internal_offset) {
			Skip(scan_state, internal_offset);
		}
		return scan_state;
	}